

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O2

void __thiscall
Js::TypePath::ClearIsFixedFieldAt(TypePath *this,PropertyIndex index,int typePathLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BVIndex i;
  undefined6 in_register_00000032;
  Data *this_00;
  
  if (((this->data).ptr)->maxInitializedLength <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x19e,"(index < this->GetMaxInitializedLength())",
                                "index < this->GetMaxInitializedLength()");
    if (!bVar2) goto LAB_00c50324;
    *puVar3 = 0;
  }
  i = (BVIndex)CONCAT62(in_register_00000032,index);
  if (typePathLength <= (int)i) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x19f,"(index < typePathLength)","index < typePathLength");
    if (!bVar2) goto LAB_00c50324;
    *puVar3 = 0;
  }
  this_00 = (this->data).ptr;
  if ((int)(uint)this_00->pathLength < typePathLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x1a0,"(typePathLength <= this->GetPathLength())",
                                "typePathLength <= this->GetPathLength()");
    if (!bVar2) {
LAB_00c50324:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = (this->data).ptr;
  }
  BVStatic<128UL>::Clear(&this_00->fixedFields,i);
  BVStatic<128UL>::Clear(&((this->data).ptr)->usedFixedFields,i);
  return;
}

Assistant:

void ClearIsFixedFieldAt(PropertyIndex index, int typePathLength)
        {
            Assert(index < this->GetMaxInitializedLength());
            Assert(index < typePathLength);
            Assert(typePathLength <= this->GetPathLength());

            this->GetData()->fixedFields.Clear(index);
            this->GetData()->usedFixedFields.Clear(index);
        }